

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int addk(FuncState *fs,Proto *f,TValue *v)

{
  int iVar1;
  int nelems;
  lua_State *L;
  TValue *pTVar2;
  long lVar3;
  lu_byte *plVar4;
  
  L = fs->ls->L;
  iVar1 = f->sizek;
  nelems = fs->nk;
  pTVar2 = (TValue *)luaM_growaux_(L,f->k,nelems,&f->sizek,0x10,0x1ffffff,"constants");
  f->k = pTVar2;
  if (iVar1 < f->sizek) {
    lVar3 = (long)f->sizek - (long)iVar1;
    plVar4 = &pTVar2[iVar1].tt_;
    do {
      *plVar4 = '\0';
      plVar4 = plVar4 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  pTVar2[nelems].value_ = v->value_;
  pTVar2[nelems].tt_ = v->tt_;
  fs->nk = fs->nk + 1;
  if ((((v->tt_ & 0x40) != 0) && ((f->marked & 0x20) != 0)) &&
     ((((v->value_).gc)->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)f,(v->value_).gc);
  }
  return nelems;
}

Assistant:

static int addk (FuncState *fs, Proto *f, TValue *v) {
  lua_State *L = fs->ls->L;
  int oldsize = f->sizek;
  int k = fs->nk;
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek)
    setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}